

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotation.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotation::SetSpindleConstraint
          (ChLinkMotorRotation *this,SpindleConstraint mconstraint)

{
  switch(mconstraint) {
  case FREE:
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_x = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = false;
    ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
    return;
  case REVOLUTE:
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = true;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_x = true;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = true;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = true;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = true;
    ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
    return;
  case CYLINDRICAL:
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_x = true;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = true;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = true;
    break;
  case OLDHAM:
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_x = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = true;
    break;
  default:
    return;
  }
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = true;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  return;
}

Assistant:

void ChLinkMotorRotation::SetSpindleConstraint(const SpindleConstraint mconstraint) {
    if (mconstraint == SpindleConstraint::FREE) {
        this->c_x = false;
        this->c_y = false;
        this->c_z = false;
        this->c_rx = false;
        this->c_ry = false;
        SetupLinkMask();
    }
    if (mconstraint == SpindleConstraint::REVOLUTE) {
        this->c_x = true;
        this->c_y = true;
        this->c_z = true;
        this->c_rx = true;
        this->c_ry = true;
        SetupLinkMask();
    }
    if (mconstraint == SpindleConstraint::CYLINDRICAL) {
        this->c_x = true;
        this->c_y = true;
        this->c_z = false;
        this->c_rx = true;
        this->c_ry = true;
        SetupLinkMask();
    }
    if (mconstraint == SpindleConstraint::OLDHAM) {
        this->c_x = false;
        this->c_y = false;
        this->c_z = false;
        this->c_rx = true;
        this->c_ry = true;
        SetupLinkMask();
    }
}